

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeAllExtensions
          (MessageGenerator *this,Printer *p)

{
  char acVar1 [8];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_28 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  v.storage_.callback_buffer_ = (char  [8])p;
  protobuf::io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)local_28,p,&this->variables_);
  acVar1 = v.storage_.callback_buffer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "\n        // All extensions.\n        target = this_.$extensions$._InternalSerializeAll(&default_instance(),\n                                                          target, stream);\n      "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit((Printer *)acVar1,local_38._M_len,local_38._M_str);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)local_28);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeAllExtensions(io::Printer* p) {
  auto v = p->WithVars(variables_);
  p->Emit(
      R"cc(
        // All extensions.
        target = this_.$extensions$._InternalSerializeAll(&default_instance(),
                                                          target, stream);
      )cc");
}